

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_setSaneConfig
              (char *organization,char *appName,char *archiveExt,int includeCdRoms,int archivesFirst
              )

{
  int iVar1;
  char *newDir;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  char *local_48;
  size_t local_40;
  int local_38;
  undefined4 local_34;
  
  if (initialized == '\0') {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_INITIALIZED);
    iVar3 = 0;
  }
  else {
    newDir = PHYSFS_getPrefDir(organization,appName);
    pcVar4 = baseDir;
    iVar3 = 0;
    if ((newDir != (char *)0x0) && (iVar3 = 0, baseDir != (char *)0x0)) {
      iVar1 = PHYSFS_setWriteDir(newDir);
      if (iVar1 == 0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
      }
      else {
        doMount((PHYSFS_Io *)0x0,newDir,(char *)0x0,0);
        doMount((PHYSFS_Io *)0x0,pcVar4,(char *)0x0,1);
        if (includeCdRoms != 0) {
          ppcVar2 = PHYSFS_getCdRomDirs();
          pcVar4 = *ppcVar2;
          ppcVar5 = ppcVar2;
          if (pcVar4 != (char *)0x0) {
            do {
              doMount((PHYSFS_Io *)0x0,pcVar4,(char *)0x0,1);
              pcVar4 = ppcVar5[1];
              ppcVar5 = ppcVar5 + 1;
            } while (pcVar4 != (char *)0x0);
            pcVar4 = *ppcVar2;
            ppcVar5 = ppcVar2;
            while (pcVar4 != (char *)0x0) {
              ppcVar5 = ppcVar5 + 1;
              (*__PHYSFS_AllocatorHooks.Free)(pcVar4);
              pcVar4 = *ppcVar5;
            }
          }
          (*__PHYSFS_AllocatorHooks.Free)(ppcVar2);
        }
        iVar3 = 1;
        if (archiveExt != (char *)0x0) {
          local_48 = archiveExt;
          local_40 = strlen(archiveExt);
          local_34 = 0;
          local_38 = archivesFirst;
          PHYSFS_enumerate("/",setSaneCfgEnumCallback,&local_48);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int PHYSFS_setSaneConfig(const char *organization, const char *appName,
                         const char *archiveExt, int includeCdRoms,
                         int archivesFirst)
{
    const char *basedir;
    const char *prefdir;

    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);

    prefdir = PHYSFS_getPrefDir(organization, appName);
    BAIL_IF_ERRPASS(!prefdir, 0);

    basedir = PHYSFS_getBaseDir();
    BAIL_IF_ERRPASS(!basedir, 0);

    BAIL_IF(!PHYSFS_setWriteDir(prefdir), PHYSFS_ERR_NO_WRITE_DIR, 0);

    /* !!! FIXME: these can fail and we should report that... */

    /* Put write dir first in search path... */
    PHYSFS_mount(prefdir, NULL, 0);

    /* Put base path on search path... */
    PHYSFS_mount(basedir, NULL, 1);

    /* handle CD-ROMs... */
    if (includeCdRoms)
    {
        char **cds = PHYSFS_getCdRomDirs();
        char **i;
        for (i = cds; *i != NULL; i++)
            PHYSFS_mount(*i, NULL, 1);
        PHYSFS_freeList(cds);
    } /* if */

    /* Root out archives, and add them to search path... */
    if (archiveExt != NULL)
    {
        setSaneCfgEnumData data;
        memset(&data, '\0', sizeof (data));
        data.archiveExt = archiveExt;
        data.archiveExtLen = strlen(archiveExt);
        data.archivesFirst = archivesFirst;
        data.errcode = PHYSFS_ERR_OK;
        if (!PHYSFS_enumerate("/", setSaneCfgEnumCallback, &data))
        {
            /* !!! FIXME: use this if we're reporting errors.
            PHYSFS_ErrorCode errcode = currentErrorCode();
            if (errcode == PHYSFS_ERR_APP_CALLBACK)
                errcode = data->errcode; */
        } /* if */
    } /* if */

    return 1;
}